

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O0

Span<const_CRPCCommand> wallet::GetWalletRPCCommands(void)

{
  Span<const_CRPCCommand> SVar1;
  int iVar2;
  long in_FS_OFFSET;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff498;
  RpcMethodFnType in_stack_fffffffffffff4b8;
  string *in_stack_fffffffffffff4c0;
  string *category;
  CRPCCommand *in_stack_fffffffffffff4c8;
  CRPCCommand *this;
  allocator<char> *in_stack_fffffffffffff4d8;
  allocator<char> *__a;
  char *in_stack_fffffffffffff4e0;
  allocator<char> *__s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff4e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  undefined1 local_8fd;
  undefined1 local_8fc [2];
  allocator<char> local_8fa;
  allocator<char> local_8f9;
  undefined1 local_8f8 [2];
  allocator<char> local_8f6;
  allocator<char> local_8f5;
  allocator<char> local_8f4;
  allocator<char> local_8f3;
  allocator<char> local_8f2;
  allocator<char> local_8f1;
  allocator<char> local_8f0;
  allocator<char> local_8ef;
  allocator<char> local_8ee;
  allocator<char> local_8ed;
  allocator<char> local_8ec;
  allocator<char> local_8eb;
  allocator<char> local_8ea;
  allocator<char> local_8e9;
  allocator<char> local_8e8;
  allocator<char> local_8e7;
  allocator<char> local_8e6;
  allocator<char> local_8e5;
  allocator<char> local_8e4;
  allocator<char> local_8e3;
  allocator<char> local_8e2;
  allocator<char> local_8e1;
  allocator<char> local_8e0;
  allocator<char> local_8df;
  allocator<char> local_8de;
  allocator<char> local_8dd;
  allocator<char> local_8dc;
  allocator<char> local_8db;
  allocator<char> local_8da;
  allocator<char> local_8d9;
  allocator<char> local_8d8;
  allocator<char> local_8d7;
  allocator<char> local_8d6;
  allocator<char> local_8d5;
  allocator<char> local_8d4;
  allocator<char> local_8d3;
  allocator<char> local_8d2;
  allocator<char> local_8d1;
  allocator<char> local_8d0;
  allocator<char> local_8cf;
  allocator<char> local_8ce;
  allocator<char> local_8cd;
  allocator<char> local_8cc;
  allocator<char> local_8cb;
  allocator<char> local_8ca;
  allocator<char> local_8c9;
  allocator<char> local_8c8;
  allocator<char> local_8c7;
  allocator<char> local_8c6;
  allocator<char> local_8c5;
  allocator<char> local_8c4;
  allocator<char> local_8c3;
  allocator<char> local_8c2;
  allocator<char> local_8c1;
  allocator<char> local_8c0;
  allocator<char> local_8bf;
  allocator<char> local_8be;
  allocator<char> local_8bd;
  allocator<char> local_8bc;
  allocator<char> local_8bb;
  allocator<char> local_8ba;
  allocator<char> local_8b9 [9];
  size_t local_8b0;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (GetWalletRPCCommands()::commands == '\0') {
    iVar2 = __cxa_guard_acquire(&GetWalletRPCCommands()::commands);
    if (iVar2 != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffff4e8,in_stack_fffffffffffff4e0,in_stack_fffffffffffff4d8);
      CRPCCommand::CRPCCommand
                (in_stack_fffffffffffff4c8,in_stack_fffffffffffff4c0,in_stack_fffffffffffff4b8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffff4e8,in_stack_fffffffffffff4e0,in_stack_fffffffffffff4d8);
      CRPCCommand::CRPCCommand
                (in_stack_fffffffffffff4c8,in_stack_fffffffffffff4c0,in_stack_fffffffffffff4b8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffff4e8,in_stack_fffffffffffff4e0,in_stack_fffffffffffff4d8);
      CRPCCommand::CRPCCommand
                (in_stack_fffffffffffff4c8,in_stack_fffffffffffff4c0,in_stack_fffffffffffff4b8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffff4e8,in_stack_fffffffffffff4e0,in_stack_fffffffffffff4d8);
      CRPCCommand::CRPCCommand
                (in_stack_fffffffffffff4c8,in_stack_fffffffffffff4c0,in_stack_fffffffffffff4b8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffff4e8,in_stack_fffffffffffff4e0,in_stack_fffffffffffff4d8);
      CRPCCommand::CRPCCommand
                (in_stack_fffffffffffff4c8,in_stack_fffffffffffff4c0,in_stack_fffffffffffff4b8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffff4e8,in_stack_fffffffffffff4e0,in_stack_fffffffffffff4d8);
      CRPCCommand::CRPCCommand
                (in_stack_fffffffffffff4c8,in_stack_fffffffffffff4c0,in_stack_fffffffffffff4b8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffff4e8,in_stack_fffffffffffff4e0,in_stack_fffffffffffff4d8);
      CRPCCommand::CRPCCommand
                (in_stack_fffffffffffff4c8,in_stack_fffffffffffff4c0,in_stack_fffffffffffff4b8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffff4e8,in_stack_fffffffffffff4e0,in_stack_fffffffffffff4d8);
      CRPCCommand::CRPCCommand
                (in_stack_fffffffffffff4c8,in_stack_fffffffffffff4c0,in_stack_fffffffffffff4b8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffff4e8,in_stack_fffffffffffff4e0,in_stack_fffffffffffff4d8);
      CRPCCommand::CRPCCommand
                (in_stack_fffffffffffff4c8,in_stack_fffffffffffff4c0,in_stack_fffffffffffff4b8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffff4e8,in_stack_fffffffffffff4e0,in_stack_fffffffffffff4d8);
      CRPCCommand::CRPCCommand
                (in_stack_fffffffffffff4c8,in_stack_fffffffffffff4c0,in_stack_fffffffffffff4b8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffff4e8,in_stack_fffffffffffff4e0,in_stack_fffffffffffff4d8);
      CRPCCommand::CRPCCommand
                (in_stack_fffffffffffff4c8,in_stack_fffffffffffff4c0,in_stack_fffffffffffff4b8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffff4e8,in_stack_fffffffffffff4e0,in_stack_fffffffffffff4d8);
      CRPCCommand::CRPCCommand
                (in_stack_fffffffffffff4c8,in_stack_fffffffffffff4c0,in_stack_fffffffffffff4b8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffff4e8,in_stack_fffffffffffff4e0,in_stack_fffffffffffff4d8);
      CRPCCommand::CRPCCommand
                (in_stack_fffffffffffff4c8,in_stack_fffffffffffff4c0,in_stack_fffffffffffff4b8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffff4e8,in_stack_fffffffffffff4e0,in_stack_fffffffffffff4d8);
      CRPCCommand::CRPCCommand
                (in_stack_fffffffffffff4c8,in_stack_fffffffffffff4c0,in_stack_fffffffffffff4b8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffff4e8,in_stack_fffffffffffff4e0,in_stack_fffffffffffff4d8);
      CRPCCommand::CRPCCommand
                (in_stack_fffffffffffff4c8,in_stack_fffffffffffff4c0,in_stack_fffffffffffff4b8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffff4e8,in_stack_fffffffffffff4e0,in_stack_fffffffffffff4d8);
      CRPCCommand::CRPCCommand
                (in_stack_fffffffffffff4c8,in_stack_fffffffffffff4c0,in_stack_fffffffffffff4b8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffff4e8,in_stack_fffffffffffff4e0,in_stack_fffffffffffff4d8);
      CRPCCommand::CRPCCommand
                (in_stack_fffffffffffff4c8,in_stack_fffffffffffff4c0,in_stack_fffffffffffff4b8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffff4e8,in_stack_fffffffffffff4e0,in_stack_fffffffffffff4d8);
      CRPCCommand::CRPCCommand
                (in_stack_fffffffffffff4c8,in_stack_fffffffffffff4c0,in_stack_fffffffffffff4b8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffff4e8,in_stack_fffffffffffff4e0,in_stack_fffffffffffff4d8);
      CRPCCommand::CRPCCommand
                (in_stack_fffffffffffff4c8,in_stack_fffffffffffff4c0,in_stack_fffffffffffff4b8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffff4e8,in_stack_fffffffffffff4e0,in_stack_fffffffffffff4d8);
      CRPCCommand::CRPCCommand
                (in_stack_fffffffffffff4c8,in_stack_fffffffffffff4c0,in_stack_fffffffffffff4b8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffff4e8,in_stack_fffffffffffff4e0,in_stack_fffffffffffff4d8);
      CRPCCommand::CRPCCommand
                (in_stack_fffffffffffff4c8,in_stack_fffffffffffff4c0,in_stack_fffffffffffff4b8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffff4e8,in_stack_fffffffffffff4e0,in_stack_fffffffffffff4d8);
      CRPCCommand::CRPCCommand
                (in_stack_fffffffffffff4c8,in_stack_fffffffffffff4c0,in_stack_fffffffffffff4b8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffff4e8,in_stack_fffffffffffff4e0,in_stack_fffffffffffff4d8);
      CRPCCommand::CRPCCommand
                (in_stack_fffffffffffff4c8,in_stack_fffffffffffff4c0,in_stack_fffffffffffff4b8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffff4e8,in_stack_fffffffffffff4e0,in_stack_fffffffffffff4d8);
      CRPCCommand::CRPCCommand
                (in_stack_fffffffffffff4c8,in_stack_fffffffffffff4c0,in_stack_fffffffffffff4b8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffff4e8,in_stack_fffffffffffff4e0,in_stack_fffffffffffff4d8);
      CRPCCommand::CRPCCommand
                (in_stack_fffffffffffff4c8,in_stack_fffffffffffff4c0,in_stack_fffffffffffff4b8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffff4e8,in_stack_fffffffffffff4e0,in_stack_fffffffffffff4d8);
      CRPCCommand::CRPCCommand
                (in_stack_fffffffffffff4c8,in_stack_fffffffffffff4c0,in_stack_fffffffffffff4b8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffff4e8,in_stack_fffffffffffff4e0,in_stack_fffffffffffff4d8);
      CRPCCommand::CRPCCommand
                (in_stack_fffffffffffff4c8,in_stack_fffffffffffff4c0,in_stack_fffffffffffff4b8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffff4e8,in_stack_fffffffffffff4e0,in_stack_fffffffffffff4d8);
      CRPCCommand::CRPCCommand
                (in_stack_fffffffffffff4c8,in_stack_fffffffffffff4c0,in_stack_fffffffffffff4b8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffff4e8,in_stack_fffffffffffff4e0,in_stack_fffffffffffff4d8);
      CRPCCommand::CRPCCommand
                (in_stack_fffffffffffff4c8,in_stack_fffffffffffff4c0,in_stack_fffffffffffff4b8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffff4e8,in_stack_fffffffffffff4e0,in_stack_fffffffffffff4d8);
      CRPCCommand::CRPCCommand
                (in_stack_fffffffffffff4c8,in_stack_fffffffffffff4c0,in_stack_fffffffffffff4b8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffff4e8,in_stack_fffffffffffff4e0,in_stack_fffffffffffff4d8);
      CRPCCommand::CRPCCommand
                (in_stack_fffffffffffff4c8,in_stack_fffffffffffff4c0,in_stack_fffffffffffff4b8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffff4e8,in_stack_fffffffffffff4e0,in_stack_fffffffffffff4d8);
      CRPCCommand::CRPCCommand
                (in_stack_fffffffffffff4c8,in_stack_fffffffffffff4c0,in_stack_fffffffffffff4b8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffff4e8,in_stack_fffffffffffff4e0,in_stack_fffffffffffff4d8);
      CRPCCommand::CRPCCommand
                (in_stack_fffffffffffff4c8,in_stack_fffffffffffff4c0,in_stack_fffffffffffff4b8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffff4e8,in_stack_fffffffffffff4e0,in_stack_fffffffffffff4d8);
      CRPCCommand::CRPCCommand
                (in_stack_fffffffffffff4c8,in_stack_fffffffffffff4c0,in_stack_fffffffffffff4b8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffff4e8,in_stack_fffffffffffff4e0,in_stack_fffffffffffff4d8);
      CRPCCommand::CRPCCommand
                (in_stack_fffffffffffff4c8,in_stack_fffffffffffff4c0,in_stack_fffffffffffff4b8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffff4e8,in_stack_fffffffffffff4e0,in_stack_fffffffffffff4d8);
      CRPCCommand::CRPCCommand
                (in_stack_fffffffffffff4c8,in_stack_fffffffffffff4c0,in_stack_fffffffffffff4b8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffff4e8,in_stack_fffffffffffff4e0,in_stack_fffffffffffff4d8);
      CRPCCommand::CRPCCommand
                (in_stack_fffffffffffff4c8,in_stack_fffffffffffff4c0,in_stack_fffffffffffff4b8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffff4e8,in_stack_fffffffffffff4e0,in_stack_fffffffffffff4d8);
      CRPCCommand::CRPCCommand
                (in_stack_fffffffffffff4c8,in_stack_fffffffffffff4c0,in_stack_fffffffffffff4b8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffff4e8,in_stack_fffffffffffff4e0,in_stack_fffffffffffff4d8);
      CRPCCommand::CRPCCommand
                (in_stack_fffffffffffff4c8,in_stack_fffffffffffff4c0,in_stack_fffffffffffff4b8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffff4e8,in_stack_fffffffffffff4e0,in_stack_fffffffffffff4d8);
      CRPCCommand::CRPCCommand
                (in_stack_fffffffffffff4c8,in_stack_fffffffffffff4c0,in_stack_fffffffffffff4b8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffff4e8,in_stack_fffffffffffff4e0,in_stack_fffffffffffff4d8);
      CRPCCommand::CRPCCommand
                (in_stack_fffffffffffff4c8,in_stack_fffffffffffff4c0,in_stack_fffffffffffff4b8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffff4e8,in_stack_fffffffffffff4e0,in_stack_fffffffffffff4d8);
      CRPCCommand::CRPCCommand
                (in_stack_fffffffffffff4c8,in_stack_fffffffffffff4c0,in_stack_fffffffffffff4b8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffff4e8,in_stack_fffffffffffff4e0,in_stack_fffffffffffff4d8);
      CRPCCommand::CRPCCommand
                (in_stack_fffffffffffff4c8,in_stack_fffffffffffff4c0,in_stack_fffffffffffff4b8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffff4e8,in_stack_fffffffffffff4e0,in_stack_fffffffffffff4d8);
      CRPCCommand::CRPCCommand
                (in_stack_fffffffffffff4c8,in_stack_fffffffffffff4c0,in_stack_fffffffffffff4b8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffff4e8,in_stack_fffffffffffff4e0,in_stack_fffffffffffff4d8);
      CRPCCommand::CRPCCommand
                (in_stack_fffffffffffff4c8,in_stack_fffffffffffff4c0,in_stack_fffffffffffff4b8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffff4e8,in_stack_fffffffffffff4e0,in_stack_fffffffffffff4d8);
      CRPCCommand::CRPCCommand
                (in_stack_fffffffffffff4c8,in_stack_fffffffffffff4c0,in_stack_fffffffffffff4b8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffff4e8,in_stack_fffffffffffff4e0,in_stack_fffffffffffff4d8);
      CRPCCommand::CRPCCommand
                (in_stack_fffffffffffff4c8,in_stack_fffffffffffff4c0,in_stack_fffffffffffff4b8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffff4e8,in_stack_fffffffffffff4e0,in_stack_fffffffffffff4d8);
      CRPCCommand::CRPCCommand
                (in_stack_fffffffffffff4c8,in_stack_fffffffffffff4c0,in_stack_fffffffffffff4b8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffff4e8,in_stack_fffffffffffff4e0,in_stack_fffffffffffff4d8);
      CRPCCommand::CRPCCommand
                (in_stack_fffffffffffff4c8,in_stack_fffffffffffff4c0,in_stack_fffffffffffff4b8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffff4e8,in_stack_fffffffffffff4e0,in_stack_fffffffffffff4d8);
      CRPCCommand::CRPCCommand
                (in_stack_fffffffffffff4c8,in_stack_fffffffffffff4c0,in_stack_fffffffffffff4b8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffff4e8,in_stack_fffffffffffff4e0,in_stack_fffffffffffff4d8);
      CRPCCommand::CRPCCommand
                (in_stack_fffffffffffff4c8,in_stack_fffffffffffff4c0,in_stack_fffffffffffff4b8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffff4e8,in_stack_fffffffffffff4e0,in_stack_fffffffffffff4d8);
      CRPCCommand::CRPCCommand
                (in_stack_fffffffffffff4c8,in_stack_fffffffffffff4c0,in_stack_fffffffffffff4b8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffff4e8,in_stack_fffffffffffff4e0,in_stack_fffffffffffff4d8);
      CRPCCommand::CRPCCommand
                (in_stack_fffffffffffff4c8,in_stack_fffffffffffff4c0,in_stack_fffffffffffff4b8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffff4e8,in_stack_fffffffffffff4e0,in_stack_fffffffffffff4d8);
      CRPCCommand::CRPCCommand
                (in_stack_fffffffffffff4c8,in_stack_fffffffffffff4c0,in_stack_fffffffffffff4b8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffff4e8,in_stack_fffffffffffff4e0,in_stack_fffffffffffff4d8);
      CRPCCommand::CRPCCommand
                (in_stack_fffffffffffff4c8,in_stack_fffffffffffff4c0,in_stack_fffffffffffff4b8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffff4e8,in_stack_fffffffffffff4e0,in_stack_fffffffffffff4d8);
      CRPCCommand::CRPCCommand
                (in_stack_fffffffffffff4c8,in_stack_fffffffffffff4c0,in_stack_fffffffffffff4b8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffff4e8,in_stack_fffffffffffff4e0,in_stack_fffffffffffff4d8);
      CRPCCommand::CRPCCommand
                (in_stack_fffffffffffff4c8,in_stack_fffffffffffff4c0,in_stack_fffffffffffff4b8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffff4e8,in_stack_fffffffffffff4e0,in_stack_fffffffffffff4d8);
      CRPCCommand::CRPCCommand
                (in_stack_fffffffffffff4c8,in_stack_fffffffffffff4c0,in_stack_fffffffffffff4b8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffff4e8,in_stack_fffffffffffff4e0,in_stack_fffffffffffff4d8);
      CRPCCommand::CRPCCommand
                (in_stack_fffffffffffff4c8,in_stack_fffffffffffff4c0,in_stack_fffffffffffff4b8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffff4e8,in_stack_fffffffffffff4e0,in_stack_fffffffffffff4d8);
      CRPCCommand::CRPCCommand
                (in_stack_fffffffffffff4c8,in_stack_fffffffffffff4c0,in_stack_fffffffffffff4b8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffff4e8,in_stack_fffffffffffff4e0,in_stack_fffffffffffff4d8);
      CRPCCommand::CRPCCommand
                (in_stack_fffffffffffff4c8,in_stack_fffffffffffff4c0,in_stack_fffffffffffff4b8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffff4e8,in_stack_fffffffffffff4e0,in_stack_fffffffffffff4d8);
      CRPCCommand::CRPCCommand
                (in_stack_fffffffffffff4c8,in_stack_fffffffffffff4c0,in_stack_fffffffffffff4b8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffff4e8,in_stack_fffffffffffff4e0,in_stack_fffffffffffff4d8);
      CRPCCommand::CRPCCommand
                (in_stack_fffffffffffff4c8,in_stack_fffffffffffff4c0,in_stack_fffffffffffff4b8);
      this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_8f8;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (this_00,in_stack_fffffffffffff4e0,in_stack_fffffffffffff4d8);
      CRPCCommand::CRPCCommand
                (in_stack_fffffffffffff4c8,in_stack_fffffffffffff4c0,in_stack_fffffffffffff4b8);
      __s = &local_8f9;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (this_00,(char *)__s,in_stack_fffffffffffff4d8);
      CRPCCommand::CRPCCommand
                (in_stack_fffffffffffff4c8,in_stack_fffffffffffff4c0,in_stack_fffffffffffff4b8);
      __a = &local_8fa;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(this_00,(char *)__s,__a);
      CRPCCommand::CRPCCommand
                (in_stack_fffffffffffff4c8,in_stack_fffffffffffff4c0,in_stack_fffffffffffff4b8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(this_00,(char *)__s,__a);
      CRPCCommand::CRPCCommand
                (in_stack_fffffffffffff4c8,in_stack_fffffffffffff4c0,in_stack_fffffffffffff4b8);
      this = (CRPCCommand *)local_8fc;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(this_00,(char *)__s,__a);
      CRPCCommand::CRPCCommand(this,in_stack_fffffffffffff4c0,in_stack_fffffffffffff4b8);
      category = (string *)&local_8fd;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(this_00,(char *)__s,__a);
      CRPCCommand::CRPCCommand(this,category,in_stack_fffffffffffff4b8);
      std::__cxx11::string::~string(in_stack_fffffffffffff498);
      std::allocator<char>::~allocator((allocator<char> *)&local_8fd);
      std::__cxx11::string::~string(in_stack_fffffffffffff498);
      std::allocator<char>::~allocator((allocator<char> *)local_8fc);
      std::__cxx11::string::~string(in_stack_fffffffffffff498);
      std::allocator<char>::~allocator((allocator<char> *)(local_8fc + 1));
      std::__cxx11::string::~string(in_stack_fffffffffffff498);
      std::allocator<char>::~allocator(&local_8fa);
      std::__cxx11::string::~string(in_stack_fffffffffffff498);
      std::allocator<char>::~allocator(&local_8f9);
      std::__cxx11::string::~string(in_stack_fffffffffffff498);
      std::allocator<char>::~allocator((allocator<char> *)local_8f8);
      std::__cxx11::string::~string(in_stack_fffffffffffff498);
      std::allocator<char>::~allocator((allocator<char> *)(local_8f8 + 1));
      std::__cxx11::string::~string(in_stack_fffffffffffff498);
      std::allocator<char>::~allocator(&local_8f6);
      std::__cxx11::string::~string(in_stack_fffffffffffff498);
      std::allocator<char>::~allocator(&local_8f5);
      std::__cxx11::string::~string(in_stack_fffffffffffff498);
      std::allocator<char>::~allocator(&local_8f4);
      std::__cxx11::string::~string(in_stack_fffffffffffff498);
      std::allocator<char>::~allocator(&local_8f3);
      std::__cxx11::string::~string(in_stack_fffffffffffff498);
      std::allocator<char>::~allocator(&local_8f2);
      std::__cxx11::string::~string(in_stack_fffffffffffff498);
      std::allocator<char>::~allocator(&local_8f1);
      std::__cxx11::string::~string(in_stack_fffffffffffff498);
      std::allocator<char>::~allocator(&local_8f0);
      std::__cxx11::string::~string(in_stack_fffffffffffff498);
      std::allocator<char>::~allocator(&local_8ef);
      std::__cxx11::string::~string(in_stack_fffffffffffff498);
      std::allocator<char>::~allocator(&local_8ee);
      std::__cxx11::string::~string(in_stack_fffffffffffff498);
      std::allocator<char>::~allocator(&local_8ed);
      std::__cxx11::string::~string(in_stack_fffffffffffff498);
      std::allocator<char>::~allocator(&local_8ec);
      std::__cxx11::string::~string(in_stack_fffffffffffff498);
      std::allocator<char>::~allocator(&local_8eb);
      std::__cxx11::string::~string(in_stack_fffffffffffff498);
      std::allocator<char>::~allocator(&local_8ea);
      std::__cxx11::string::~string(in_stack_fffffffffffff498);
      std::allocator<char>::~allocator(&local_8e9);
      std::__cxx11::string::~string(in_stack_fffffffffffff498);
      std::allocator<char>::~allocator(&local_8e8);
      std::__cxx11::string::~string(in_stack_fffffffffffff498);
      std::allocator<char>::~allocator(&local_8e7);
      std::__cxx11::string::~string(in_stack_fffffffffffff498);
      std::allocator<char>::~allocator(&local_8e6);
      std::__cxx11::string::~string(in_stack_fffffffffffff498);
      std::allocator<char>::~allocator(&local_8e5);
      std::__cxx11::string::~string(in_stack_fffffffffffff498);
      std::allocator<char>::~allocator(&local_8e4);
      std::__cxx11::string::~string(in_stack_fffffffffffff498);
      std::allocator<char>::~allocator(&local_8e3);
      std::__cxx11::string::~string(in_stack_fffffffffffff498);
      std::allocator<char>::~allocator(&local_8e2);
      std::__cxx11::string::~string(in_stack_fffffffffffff498);
      std::allocator<char>::~allocator(&local_8e1);
      std::__cxx11::string::~string(in_stack_fffffffffffff498);
      std::allocator<char>::~allocator(&local_8e0);
      std::__cxx11::string::~string(in_stack_fffffffffffff498);
      std::allocator<char>::~allocator(&local_8df);
      std::__cxx11::string::~string(in_stack_fffffffffffff498);
      std::allocator<char>::~allocator(&local_8de);
      std::__cxx11::string::~string(in_stack_fffffffffffff498);
      std::allocator<char>::~allocator(&local_8dd);
      std::__cxx11::string::~string(in_stack_fffffffffffff498);
      std::allocator<char>::~allocator(&local_8dc);
      std::__cxx11::string::~string(in_stack_fffffffffffff498);
      std::allocator<char>::~allocator(&local_8db);
      std::__cxx11::string::~string(in_stack_fffffffffffff498);
      std::allocator<char>::~allocator(&local_8da);
      std::__cxx11::string::~string(in_stack_fffffffffffff498);
      std::allocator<char>::~allocator(&local_8d9);
      std::__cxx11::string::~string(in_stack_fffffffffffff498);
      std::allocator<char>::~allocator(&local_8d8);
      std::__cxx11::string::~string(in_stack_fffffffffffff498);
      std::allocator<char>::~allocator(&local_8d7);
      std::__cxx11::string::~string(in_stack_fffffffffffff498);
      std::allocator<char>::~allocator(&local_8d6);
      std::__cxx11::string::~string(in_stack_fffffffffffff498);
      std::allocator<char>::~allocator(&local_8d5);
      std::__cxx11::string::~string(in_stack_fffffffffffff498);
      std::allocator<char>::~allocator(&local_8d4);
      std::__cxx11::string::~string(in_stack_fffffffffffff498);
      std::allocator<char>::~allocator(&local_8d3);
      std::__cxx11::string::~string(in_stack_fffffffffffff498);
      std::allocator<char>::~allocator(&local_8d2);
      std::__cxx11::string::~string(in_stack_fffffffffffff498);
      std::allocator<char>::~allocator(&local_8d1);
      std::__cxx11::string::~string(in_stack_fffffffffffff498);
      std::allocator<char>::~allocator(&local_8d0);
      std::__cxx11::string::~string(in_stack_fffffffffffff498);
      std::allocator<char>::~allocator(&local_8cf);
      std::__cxx11::string::~string(in_stack_fffffffffffff498);
      std::allocator<char>::~allocator(&local_8ce);
      std::__cxx11::string::~string(in_stack_fffffffffffff498);
      std::allocator<char>::~allocator(&local_8cd);
      std::__cxx11::string::~string(in_stack_fffffffffffff498);
      std::allocator<char>::~allocator(&local_8cc);
      std::__cxx11::string::~string(in_stack_fffffffffffff498);
      std::allocator<char>::~allocator(&local_8cb);
      std::__cxx11::string::~string(in_stack_fffffffffffff498);
      std::allocator<char>::~allocator(&local_8ca);
      std::__cxx11::string::~string(in_stack_fffffffffffff498);
      std::allocator<char>::~allocator(&local_8c9);
      std::__cxx11::string::~string(in_stack_fffffffffffff498);
      std::allocator<char>::~allocator(&local_8c8);
      std::__cxx11::string::~string(in_stack_fffffffffffff498);
      std::allocator<char>::~allocator(&local_8c7);
      std::__cxx11::string::~string(in_stack_fffffffffffff498);
      std::allocator<char>::~allocator(&local_8c6);
      std::__cxx11::string::~string(in_stack_fffffffffffff498);
      std::allocator<char>::~allocator(&local_8c5);
      std::__cxx11::string::~string(in_stack_fffffffffffff498);
      std::allocator<char>::~allocator(&local_8c4);
      std::__cxx11::string::~string(in_stack_fffffffffffff498);
      std::allocator<char>::~allocator(&local_8c3);
      std::__cxx11::string::~string(in_stack_fffffffffffff498);
      std::allocator<char>::~allocator(&local_8c2);
      std::__cxx11::string::~string(in_stack_fffffffffffff498);
      std::allocator<char>::~allocator(&local_8c1);
      std::__cxx11::string::~string(in_stack_fffffffffffff498);
      std::allocator<char>::~allocator(&local_8c0);
      std::__cxx11::string::~string(in_stack_fffffffffffff498);
      std::allocator<char>::~allocator(&local_8bf);
      std::__cxx11::string::~string(in_stack_fffffffffffff498);
      std::allocator<char>::~allocator(&local_8be);
      std::__cxx11::string::~string(in_stack_fffffffffffff498);
      std::allocator<char>::~allocator(&local_8bd);
      std::__cxx11::string::~string(in_stack_fffffffffffff498);
      std::allocator<char>::~allocator(&local_8bc);
      std::__cxx11::string::~string(in_stack_fffffffffffff498);
      std::allocator<char>::~allocator(&local_8bb);
      std::__cxx11::string::~string(in_stack_fffffffffffff498);
      std::allocator<char>::~allocator(&local_8ba);
      std::__cxx11::string::~string(in_stack_fffffffffffff498);
      std::allocator<char>::~allocator(local_8b9);
      __cxa_atexit(__cxx_global_array_dtor,0,&__dso_handle);
      __cxa_guard_release(&GetWalletRPCCommands()::commands);
    }
  }
  Span<const_CRPCCommand>::Span<69>
            ((Span<const_CRPCCommand> *)in_stack_fffffffffffff498,(CRPCCommand (*) [69])0x9d6be0);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    SVar1.m_size = local_8b0;
    SVar1.m_data = (CRPCCommand *)local_8b9._1_8_;
    return SVar1;
  }
  __stack_chk_fail();
}

Assistant:

Span<const CRPCCommand> GetWalletRPCCommands()
{
    static const CRPCCommand commands[]{
        {"rawtransactions", &fundrawtransaction},
        {"wallet", &abandontransaction},
        {"wallet", &abortrescan},
        {"wallet", &addmultisigaddress},
        {"wallet", &backupwallet},
        {"wallet", &bumpfee},
        {"wallet", &psbtbumpfee},
        {"wallet", &createwallet},
        {"wallet", &createwalletdescriptor},
        {"wallet", &restorewallet},
        {"wallet", &dumpprivkey},
        {"wallet", &dumpwallet},
        {"wallet", &encryptwallet},
        {"wallet", &getaddressesbylabel},
        {"wallet", &getaddressinfo},
        {"wallet", &getbalance},
        {"wallet", &gethdkeys},
        {"wallet", &getnewaddress},
        {"wallet", &getrawchangeaddress},
        {"wallet", &getreceivedbyaddress},
        {"wallet", &getreceivedbylabel},
        {"wallet", &gettransaction},
        {"wallet", &getunconfirmedbalance},
        {"wallet", &getbalances},
        {"wallet", &getwalletinfo},
        {"wallet", &importaddress},
        {"wallet", &importdescriptors},
        {"wallet", &importmulti},
        {"wallet", &importprivkey},
        {"wallet", &importprunedfunds},
        {"wallet", &importpubkey},
        {"wallet", &importwallet},
        {"wallet", &keypoolrefill},
        {"wallet", &listaddressgroupings},
        {"wallet", &listdescriptors},
        {"wallet", &listlabels},
        {"wallet", &listlockunspent},
        {"wallet", &listreceivedbyaddress},
        {"wallet", &listreceivedbylabel},
        {"wallet", &listsinceblock},
        {"wallet", &listtransactions},
        {"wallet", &listunspent},
        {"wallet", &listwalletdir},
        {"wallet", &listwallets},
        {"wallet", &loadwallet},
        {"wallet", &lockunspent},
        {"wallet", &migratewallet},
        {"wallet", &newkeypool},
        {"wallet", &removeprunedfunds},
        {"wallet", &rescanblockchain},
        {"wallet", &send},
        {"wallet", &sendmany},
        {"wallet", &sendtoaddress},
        {"wallet", &sethdseed},
        {"wallet", &setlabel},
        {"wallet", &settxfee},
        {"wallet", &setwalletflag},
        {"wallet", &signmessage},
        {"wallet", &signrawtransactionwithwallet},
        {"wallet", &simulaterawtransaction},
        {"wallet", &sendall},
        {"wallet", &unloadwallet},
        {"wallet", &upgradewallet},
        {"wallet", &walletcreatefundedpsbt},
#ifdef ENABLE_EXTERNAL_SIGNER
        {"wallet", &walletdisplayaddress},
#endif // ENABLE_EXTERNAL_SIGNER
        {"wallet", &walletlock},
        {"wallet", &walletpassphrase},
        {"wallet", &walletpassphrasechange},
        {"wallet", &walletprocesspsbt},
    };
    return commands;
}